

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Fts5Auxiliary * fts5FindAuxiliary(Fts5FullTable *pTab,char *zName)

{
  Fts5Auxiliary *pFVar1;
  int iVar2;
  Fts5Auxiliary **ppFVar3;
  
  ppFVar3 = &pTab->pGlobal->pAux;
  while( true ) {
    pFVar1 = *ppFVar3;
    if (pFVar1 == (Fts5Auxiliary *)0x0) {
      return (Fts5Auxiliary *)0x0;
    }
    iVar2 = sqlite3_stricmp(zName,pFVar1->zFunc);
    if (iVar2 == 0) break;
    ppFVar3 = &pFVar1->pNext;
  }
  return pFVar1;
}

Assistant:

static Fts5Auxiliary *fts5FindAuxiliary(Fts5FullTable *pTab, const char *zName){
  Fts5Auxiliary *pAux;

  for(pAux=pTab->pGlobal->pAux; pAux; pAux=pAux->pNext){
    if( sqlite3_stricmp(zName, pAux->zFunc)==0 ) return pAux;
  }

  /* No function of the specified name was found. Return 0. */
  return 0;
}